

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

int CVodeQuadSensEEtolerances(void *cvode_mem)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0xa2e;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x860) != 0) {
      if (*(int *)((long)cvode_mem + 0x86c) != 0) {
        *(undefined4 *)((long)cvode_mem + 0x128) = 4;
        return 0;
      }
      cvProcessError((CVodeMem)cvode_mem,-0x32,0xa40,"CVodeQuadSensEEtolerances",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"Forward sensitivity analysis for quadrature variables not activated.");
      return -0x1e;
    }
    msgfmt = "Forward sensitivity analysis not activated.";
    error_code = -0x28;
    line = 0xa37;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeQuadSensEEtolerances",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeQuadSensEEtolerances(void* cvode_mem)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* check if sensitivity was initialized */

  if (cv_mem->cv_SensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  /* Ckeck if quadrature sensitivity was initialized? */

  if (cv_mem->cv_QuadSensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUADSENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUADSENSI);
    return (CV_NO_QUAD);
  }

  cv_mem->cv_itolQS = CV_EE;

  return (CV_SUCCESS);
}